

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O1

void __thiscall test_b_tree::test_basic_remove(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  runtime_error *prVar2;
  long lVar3;
  undefined8 *puVar4;
  string *psVar5;
  pointer plVar6;
  bool bVar7;
  byte bVar8;
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  optional<long> oVar9;
  b_tree t;
  allocator_type local_e1;
  vector<long,_std::allocator<long>_> local_e0;
  string local_c8 [2];
  b_tree local_78;
  
  bVar8 = 0;
  paVar1 = &local_78._p._fileName.field_2;
  local_78._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"test_basic_remove.db","");
  b_tree::create_db_file((string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._p._fileName._M_dataplus._M_p,
                    local_78._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_c8[0]._M_dataplus._M_p = (pointer)&local_c8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"test_basic_remove.db","");
  b_tree::b_tree(&local_78,local_c8,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8[0]._M_dataplus._M_p != &local_c8[0].field_2) {
    operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
  }
  puVar4 = &DAT_0010a538;
  psVar5 = local_c8;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (psVar5->_M_dataplus)._M_p = (pointer)*puVar4;
    puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
    psVar5 = (string *)((long)psVar5 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  __l._M_len = 10;
  __l._M_array = (iterator)local_c8;
  std::vector<long,_std::allocator<long>_>::vector(&local_e0,__l,&local_e1);
  insert_all<b_tree>(&local_78,&local_e0);
  if (local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (int64_t *)0x0) {
    operator_delete(local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  b_tree::remove(&local_78,(char *)0x1e);
  oVar9 = b_tree::search(&local_78,0x1e);
  if (((undefined1  [16])
       oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    rtf_format_abi_cxx11_
              (local_c8,"%s at Line:%d File:%s","!t.search(30)",0x71,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
              );
    std::runtime_error::runtime_error(prVar2,(string *)local_c8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar4 = &DAT_0010a588;
  psVar5 = local_c8;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (psVar5->_M_dataplus)._M_p = (pointer)*puVar4;
    puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
    psVar5 = (string *)((long)psVar5 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)local_c8;
  std::vector<long,_std::allocator<long>_>::vector(&local_e0,__l_00,&local_e1);
  bVar7 = local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish;
  if (!bVar7) {
    plVar6 = local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      oVar9 = b_tree::search(&local_78,*plVar6);
      if (((undefined1  [16])
           oVar9.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      break;
      plVar6 = plVar6 + 1;
      bVar7 = plVar6 == local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    } while (!bVar7);
  }
  if (local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (int64_t *)0x0) {
    operator_delete(local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bVar7) {
    unlink("test_basic_remove.db");
    pager::~pager(&local_78._p);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  rtf_format_abi_cxx11_
            (local_c8,"%s at Line:%d File:%s",
             "has_all_keys(t, {10, 20, 40, 50, 60, 70, 80, 90, 100})",0x72,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
            );
  std::runtime_error::runtime_error(prVar2,(string *)local_c8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}